

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void goodform::json::write_string(string *input,ostream *output)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uStack_20;
  char c;
  unsigned_long i;
  ostream *output_local;
  string *input_local;
  
  std::operator<<(output,"\"");
  for (uStack_20 = 0; uVar2 = std::__cxx11::string::length(), uStack_20 < uVar2;
      uStack_20 = uStack_20 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = *pcVar3;
    if (cVar1 == '\\') {
      std::operator<<(output,"\\\\");
    }
    else if (cVar1 == '/') {
      std::operator<<(output,"\\/");
    }
    else if (cVar1 == '\"') {
      std::operator<<(output,"\\\"");
    }
    else if (cVar1 == '\b') {
      std::operator<<(output,"\\b");
    }
    else if (cVar1 == '\f') {
      std::operator<<(output,"\\f");
    }
    else if (cVar1 == '\n') {
      std::operator<<(output,"\\n");
    }
    else if (cVar1 == '\r') {
      std::operator<<(output,"\\r");
    }
    else if (cVar1 == '\t') {
      std::operator<<(output,"\\t");
    }
    else {
      std::operator<<(output,cVar1);
    }
  }
  std::operator<<(output,"\"");
  return;
}

Assistant:

void json::write_string(const std::string& input, std::ostream& output)
  {
    output << "\"";
    for (unsigned long i = 0; i < input.length(); ++i)
    {
      char c = input[i];
      if (c == '\\')
        output << "\\\\";
      else if (c == '/')
        output << "\\/";
      else if (c == '"')
        output << "\\\"";
      else if (c == '\b')
        output << "\\b";
      else if (c == '\f')
        output << "\\f";
      else if (c == '\n')
        output << "\\n";
      else if (c == '\r')
        output << "\\r";
      else if (c == '\t')
        output << "\\t";
      else
        output << c;
    }
    output << "\"";
  }